

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
Validator_duplicateIdSimple_Test::~Validator_duplicateIdSimple_Test
          (Validator_duplicateIdSimple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, duplicateIdSimple)
{
    std::vector<std::string> e = {"Duplicated identifier attribute 'id' has been found in:\n"
                                  " - model 'model';\n"
                                  " - component 'c1' in model 'model';\n"
                                  " - variable 'v1' in component 'c1';\n"
                                  " - component 'c2' in component 'c1'; and\n"
                                  " - variable 'v2' in component 'c2'.\n"};

    auto model = createModelTwoComponentsWithOneVariableEach("model", "c1", "c2", "v1", "v2");
    model->setId("id");
    model->component(0)->setId("id");
    model->component(1)->setId("id");
    model->component(0)->variable(0)->setId("id");
    model->component(1)->variable(0)->setId("id");
    model->component(0)->variable(0)->setUnits("dimensionless");
    model->component(1)->variable(0)->setUnits("dimensionless");
    model->component(0)->addComponent(model->component(1));

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);
    EXPECT_EQ_ISSUES(e, validator);
}